

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O0

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  bool bVar1;
  size_type sVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *in_RDI;
  pair<std::_Rb_tree_const_iterator<testing::internal::String>,_bool> pVar5;
  String *errors_str;
  DefinedTestIter it_1;
  DefinedTestIter it;
  bool found;
  String name;
  char *names;
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  tests;
  Message errors;
  set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>
  *in_stack_fffffffffffffe68;
  String *in_stack_fffffffffffffe70;
  String *pSVar6;
  key_type *in_stack_fffffffffffffe78;
  String *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  FILE *__stream;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  char *in_stack_fffffffffffffe98;
  String *in_stack_fffffffffffffea0;
  size_type in_stack_fffffffffffffef0;
  int line_00;
  string local_100 [32];
  String local_e0;
  String *local_d0;
  _Self local_b8;
  _Self local_b0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  _Self local_98;
  _Self local_90;
  byte local_81;
  undefined4 local_80;
  String *local_60;
  String *local_20;
  
  *in_RDI = '\x01';
  local_20 = (String *)SkipSpaces((char *)0x1fa806);
  Message::Message((Message *)in_stack_fffffffffffffea0);
  std::
  set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
  ::set((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
         *)0x1fa828);
  local_60 = local_20;
  do {
    if (local_60 == (String *)0x0) {
      local_b0._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     (in_stack_fffffffffffffe68);
      while( true ) {
        local_b8._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       (in_stack_fffffffffffffe68);
        bVar1 = std::operator!=(&local_b0,&local_b8);
        line_00 = (int)(in_stack_fffffffffffffef0 >> 0x20);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<const_char_*>::operator*
                  ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe70);
        String::String(in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
        sVar2 = std::
                set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                         *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        String::~String(in_stack_fffffffffffffe70);
        if (sVar2 == 0) {
          Message::operator<<((Message *)in_stack_fffffffffffffe80,
                              (char (*) [25])in_stack_fffffffffffffe78);
          std::_Rb_tree_const_iterator<const_char_*>::operator*
                    ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe70);
          Message::operator<<((Message *)in_stack_fffffffffffffe80,
                              &in_stack_fffffffffffffe78->c_str_);
          Message::operator<<((Message *)in_stack_fffffffffffffe80,
                              (char (*) [3])in_stack_fffffffffffffe78);
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++
                  ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe70);
      }
      Message::GetString((Message *)in_stack_fffffffffffffe78);
      local_d0 = &local_e0;
      bVar1 = String::operator!=(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68);
      if (bVar1) {
        __stream = _stderr;
        FormatFileLocation_abi_cxx11_(in_RDI,line_00);
        uVar3 = std::__cxx11::string::c_str();
        pcVar4 = String::c_str(local_d0);
        fprintf(__stream,"%s %s",uVar3,pcVar4);
        std::__cxx11::string::~string(local_100);
        fflush(_stderr);
        posix::Abort();
      }
      local_80 = 1;
      pSVar6 = local_20;
      String::~String(local_20);
      std::
      set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
      ::~set((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
              *)0x1fad22);
      Message::~Message((Message *)0x1fad2f);
      return (char *)pSVar6;
    }
    GetPrefixUntilComma((char *)in_stack_fffffffffffffe78);
    in_stack_fffffffffffffef0 =
         std::
         set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
         ::count((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                  *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (in_stack_fffffffffffffef0 == 0) {
      local_81 = 0;
      local_90._M_node =
           (_Base_ptr)
           std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::begin
                     (in_stack_fffffffffffffe68);
      while( true ) {
        local_98._M_node =
             (_Base_ptr)
             std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::end
                       (in_stack_fffffffffffffe68);
        bVar1 = std::operator!=(&local_90,&local_98);
        if (!bVar1) break;
        std::_Rb_tree_const_iterator<const_char_*>::operator*
                  ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe70);
        bVar1 = String::operator==(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        if (bVar1) {
          local_81 = 1;
          break;
        }
        std::_Rb_tree_const_iterator<const_char_*>::operator++
                  ((_Rb_tree_const_iterator<const_char_*> *)in_stack_fffffffffffffe70);
      }
      if ((local_81 & 1) == 0) {
        Message::operator<<((Message *)in_stack_fffffffffffffe80,
                            (char (*) [15])in_stack_fffffffffffffe78);
        Message::operator<<((Message *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        Message::operator<<((Message *)in_stack_fffffffffffffe80,
                            (char (*) [34])in_stack_fffffffffffffe78);
      }
      else {
        pVar5 = std::
                set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                ::insert((set<testing::internal::String,_std::less<testing::internal::String>,_std::allocator<testing::internal::String>_>
                          *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                         in_stack_fffffffffffffe88);
        local_a8 = (_Base_ptr)pVar5.first._M_node;
        local_a0 = pVar5.second;
      }
      local_80 = 0;
    }
    else {
      Message::operator<<((Message *)in_stack_fffffffffffffe80,
                          (char (*) [6])in_stack_fffffffffffffe78);
      Message::operator<<((Message *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      Message::operator<<((Message *)in_stack_fffffffffffffe80,
                          (char (*) [28])in_stack_fffffffffffffe78);
      local_80 = 4;
    }
    String::~String(in_stack_fffffffffffffe70);
    local_60 = (String *)SkipComma((char *)in_stack_fffffffffffffe68);
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef ::std::set<const char*>::const_iterator DefinedTestIter;
  registered_ = true;

  // Skip initial whitespace in registered_tests since some
  // preprocessors prefix stringizied literals with whitespace.
  registered_tests = SkipSpaces(registered_tests);

  Message errors;
  ::std::set<String> tests;
  for (const char* names = registered_tests; names != NULL;
       names = SkipComma(names)) {
    const String name = GetPrefixUntilComma(names);
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (DefinedTestIter it = defined_test_names_.begin();
         it != defined_test_names_.end();
         ++it) {
      if (name == *it) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (DefinedTestIter it = defined_test_names_.begin();
       it != defined_test_names_.end();
       ++it) {
    if (tests.count(*it) == 0) {
      errors << "You forgot to list test " << *it << ".\n";
    }
  }

  const String& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}